

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_chart_begin_colored
                  (nk_context *ctx,nk_chart_type type,nk_color color,nk_color highlight,int count,
                  float min_value,float max_value)

{
  nk_vec2 nVar1;
  int iVar2;
  nk_panel *pnVar3;
  nk_rect r;
  undefined1 auVar4 [16];
  nk_widget_layout_states nVar5;
  nk_chart *__s;
  nk_bool nVar6;
  ulong uVar7;
  ulong uVar8;
  nk_command_buffer *b;
  float fVar12;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar13;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect bounds;
  nk_rect local_78;
  nk_color local_64;
  nk_color local_60;
  int local_5c;
  nk_rect local_58;
  float local_48;
  float fStack_44;
  undefined8 uStack_40;
  nk_window *local_38;
  
  local_78.x = 0.0;
  local_78.y = 0.0;
  local_78.w = 0.0;
  local_78.h = 0.0;
  nVar6 = 0;
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (nVar6 = 0, ctx->current->layout != (nk_panel *)0x0)) {
    local_58.x = min_value;
    local_60 = color;
    local_5c = count;
    local_48 = max_value;
    nVar5 = nk_widget(&local_78,ctx);
    local_38 = ctx->current;
    pnVar3 = local_38->layout;
    __s = &pnVar3->chart;
    if (nVar5 == NK_WIDGET_INVALID) {
      uVar7 = (ulong)__s & 3;
      if (uVar7 == 0) {
        uVar8 = 0xb4;
      }
      else {
        memset(__s,0,4 - uVar7);
        uVar8 = uVar7 | 0xb0;
        __s = (nk_chart *)((long)__s + (4 - uVar7));
      }
      uVar7 = (ulong)((uint)uVar8 & 0xfffffffc);
      nVar6 = 0;
      memset(__s,0,uVar7);
      if ((uVar8 & 3) != 0) {
        nVar6 = 0;
        memset((void *)((long)__s->slots + (uVar7 - 0x14)),0,uVar8 & 3);
      }
    }
    else {
      uVar7 = (ulong)__s & 3;
      local_64 = highlight;
      if (uVar7 == 0) {
        uVar8 = 0xb4;
      }
      else {
        memset(__s,0,4 - uVar7);
        uVar8 = uVar7 | 0xb0;
        __s = (nk_chart *)((long)__s + (4 - uVar7));
      }
      uVar7 = (ulong)((uint)uVar8 & 0xfffffffc);
      memset(__s,0,uVar7);
      if ((uVar8 & 3) != 0) {
        memset((void *)((long)__s->slots + (uVar7 - 0x14)),0,uVar8 & 3);
      }
      nVar1 = (ctx->style).chart.padding;
      fVar13 = nVar1.x;
      fVar12 = nVar1.y;
      (pnVar3->chart).x = local_78.x + fVar13;
      (pnVar3->chart).y = local_78.y + fVar12;
      fStack_44 = local_78.h;
      auVar9._0_4_ = fVar13 + fVar13;
      auVar9._4_4_ = fVar12 + fVar12;
      auVar9._8_8_ = 0;
      auVar10._4_4_ = fStack_44 - auVar9._4_4_;
      auVar10._0_4_ = local_78.w - auVar9._0_4_;
      auVar10._8_8_ = 0;
      auVar10 = maxps(auVar9,auVar10);
      (pnVar3->chart).w = (float)(int)auVar10._0_8_;
      (pnVar3->chart).h = (float)(int)((ulong)auVar10._0_8_ >> 0x20);
      iVar2 = (pnVar3->chart).slot;
      (pnVar3->chart).slot = iVar2 + 1;
      (pnVar3->chart).slots[iVar2].type = type;
      (pnVar3->chart).slots[iVar2].count = local_5c;
      (pnVar3->chart).slots[iVar2].color = local_60;
      (pnVar3->chart).slots[iVar2].highlight = local_64;
      fVar13 = local_58.x;
      if (local_48 <= local_58.x) {
        fVar13 = local_48;
      }
      (pnVar3->chart).slots[iVar2].min = fVar13;
      fVar12 = local_48;
      if (local_48 <= local_58.x) {
        fVar12 = local_58.x;
      }
      (pnVar3->chart).slots[iVar2].max = fVar12;
      (pnVar3->chart).slots[iVar2].range = fVar12 - fVar13;
      b = &local_38->buffer;
      if ((ctx->style).chart.background.type == NK_STYLE_ITEM_IMAGE) {
        r.w = local_78.w;
        r.h = local_78.h;
        r.x = local_78.x;
        r.y = local_78.y;
        nk_draw_image(b,r,&(ctx->style).chart.background.data.image,(nk_color)0xffffffff);
      }
      else {
        local_58.x = local_78.x;
        local_58.y = local_78.y;
        local_58.w = 0.0;
        local_58.h = 0.0;
        uStack_40 = 0;
        rect.w = local_78.w;
        rect.h = local_78.h;
        rect.x = local_78.x;
        rect.y = local_78.y;
        local_48 = local_78.w;
        nk_fill_rect(b,rect,(ctx->style).chart.rounding,(ctx->style).chart.border_color);
        fVar13 = (ctx->style).chart.border;
        rect_00.x = fVar13 + local_58.x;
        rect_00.y = fVar13 + local_58.y;
        fVar13 = fVar13 + fVar13;
        auVar11._4_4_ = fVar13;
        auVar11._0_4_ = fVar13;
        auVar11._8_4_ = fVar13;
        auVar11._12_4_ = fVar13;
        auVar4._4_4_ = fStack_44;
        auVar4._0_4_ = local_48;
        auVar4._8_8_ = uStack_40;
        auVar10 = maxps(auVar11,auVar4);
        rect_00.w = auVar10._0_4_ - fVar13;
        rect_00.h = auVar10._4_4_ - fVar13;
        nk_fill_rect(b,rect_00,(ctx->style).chart.rounding,(ctx->style).chart.background.data.color)
        ;
      }
      nVar6 = 1;
    }
  }
  return nVar6;
}

Assistant:

NK_API nk_bool
nk_chart_begin_colored(struct nk_context *ctx, enum nk_chart_type type,
struct nk_color color, struct nk_color highlight,
int count, float min_value, float max_value)
{
struct nk_window *win;
struct nk_chart *chart;
const struct nk_style *config;
const struct nk_style_chart *style;

const struct nk_style_item *background;
struct nk_rect bounds = {0, 0, 0, 0};

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);

if (!ctx || !ctx->current || !ctx->current->layout) return 0;
if (!nk_widget(&bounds, ctx)) {
chart = &ctx->current->layout->chart;
nk_zero(chart, sizeof(*chart));
return 0;
}

win = ctx->current;
config = &ctx->style;
chart = &win->layout->chart;
style = &config->chart;

/* setup basic generic chart  */
nk_zero(chart, sizeof(*chart));
chart->x = bounds.x + style->padding.x;
chart->y = bounds.y + style->padding.y;
chart->w = bounds.w - 2 * style->padding.x;
chart->h = bounds.h - 2 * style->padding.y;
chart->w = NK_MAX(chart->w, 2 * style->padding.x);
chart->h = NK_MAX(chart->h, 2 * style->padding.y);

/* add first slot into chart */
{struct nk_chart_slot *slot = &chart->slots[chart->slot++];
slot->type = type;
slot->count = count;
slot->color = color;
slot->highlight = highlight;
slot->min = NK_MIN(min_value, max_value);
slot->max = NK_MAX(min_value, max_value);
slot->range = slot->max - slot->min;}

/* draw chart background */
background = &style->background;
if (background->type == NK_STYLE_ITEM_IMAGE) {
nk_draw_image(&win->buffer, bounds, &background->data.image, nk_white);
} else {
nk_fill_rect(&win->buffer, bounds, style->rounding, style->border_color);
nk_fill_rect(&win->buffer, nk_shrink_rect(bounds, style->border),
style->rounding, style->background.data.color);
}
return 1;
}